

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

AssertionExpr *
slang::ast::ClockingAssertionExpr::fromSyntax
          (ClockingSequenceExprSyntax *syntax,ASTContext *context)

{
  int iVar1;
  ASTContext *this;
  undefined4 extraout_var;
  SequenceExprSyntax *pSVar2;
  SyntaxNode *syntax_00;
  ClockingAssertionExpr *pCVar3;
  socklen_t __len;
  BumpAllocator *in_RSI;
  AssertionExpr *expr;
  TimingControl *clocking;
  Compilation *comp;
  BumpAllocator *args_1;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff90;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffa0;
  sockaddr local_58 [3];
  undefined8 local_20;
  Compilation *local_18;
  BumpAllocator *local_10;
  undefined4 extraout_var_00;
  
  local_10 = in_RSI;
  local_18 = ASTContext::getCompilation((ASTContext *)0x7cfeae);
  this = (ASTContext *)
         not_null<slang::syntax::TimingControlSyntax_*>::operator*
                   ((not_null<slang::syntax::TimingControlSyntax_*> *)0x7cfec4);
  args_1 = local_10;
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffffa0,NonProcedural);
  ASTContext::resetFlags(this,in_stack_ffffffffffffff90);
  iVar1 = TimingControl::bind((int)this,local_58,__len);
  local_20 = CONCAT44(extraout_var,iVar1);
  pSVar2 = not_null<slang::syntax::SequenceExprSyntax_*>::operator*
                     ((not_null<slang::syntax::SequenceExprSyntax_*> *)0x7cff1b);
  iVar1 = AssertionExpr::bind((int)pSVar2,(sockaddr *)local_10,0);
  syntax_00 = (SyntaxNode *)CONCAT44(extraout_var_00,iVar1);
  not_null<slang::syntax::TimingControlSyntax_*>::operator*
            ((not_null<slang::syntax::TimingControlSyntax_*> *)0x7cff4a);
  checkForClockingBlock((ASTContext *)in_stack_ffffffffffffffa0.m_bits,syntax_00);
  pCVar3 = BumpAllocator::
           emplace<slang::ast::ClockingAssertionExpr,slang::ast::TimingControl&,slang::ast::AssertionExpr_const&>
                     (local_10,(TimingControl *)this,(AssertionExpr *)args_1);
  return &pCVar3->super_AssertionExpr;
}

Assistant:

AssertionExpr& ClockingAssertionExpr::fromSyntax(const ClockingSequenceExprSyntax& syntax,
                                                 const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& clocking = TimingControl::bind(*syntax.event,
                                         context.resetFlags(ASTFlags::NonProcedural));
    auto& expr = bind(*syntax.expr, context);

    checkForClockingBlock(context, *syntax.event);

    return *comp.emplace<ClockingAssertionExpr>(clocking, expr);
}